

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O0

void __thiscall ThreadParser::~ThreadParser(ThreadParser *this)

{
  ThreadParser *this_local;
  
  if (this->fSAXParser != (SAXParser *)0x0) {
    (**(code **)(*(long *)this->fSAXParser + 8))();
  }
  if (this->fSAX2Parser != (SAX2XMLReader *)0x0) {
    (*this->fSAX2Parser->_vptr_SAX2XMLReader[1])();
  }
  if (this->fXercesDOMParser != (XercesDOMParser *)0x0) {
    (**(code **)(*(long *)this->fXercesDOMParser + 8))();
  }
  if (this->fSAXHandler != (SAXHandler *)0x0) {
    (*(this->fSAXHandler->super_HandlerBase).super_EntityResolver._vptr_EntityResolver[1])();
  }
  if (this->fSAX2Handler != (SAX2Handler *)0x0) {
    (*(this->fSAX2Handler->super_DefaultHandler).super_EntityResolver._vptr_EntityResolver[1])();
  }
  if (this->fDOMErrorHandler != (ErrorHandler *)0x0) {
    (*this->fDOMErrorHandler->_vptr_ErrorHandler[1])();
  }
  return;
}

Assistant:

ThreadParser::~ThreadParser()
{
     delete fSAXParser;
     delete fSAX2Parser;
     delete fXercesDOMParser;
     delete fSAXHandler;
     delete fSAX2Handler;
     delete fDOMErrorHandler;
}